

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

int cornerstone::buffer::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  buffer *in_stack_00000008;
  buffer *in_stack_00000010;
  bufptr *other;
  int iVar1;
  size_t in_stack_ffffffffffffffd8;
  buffer *in_stack_ffffffffffffffe0;
  
  iVar1 = (int)dst;
  size((buffer *)src);
  pos((buffer *)src);
  alloc((size_t)in_stack_00000008);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1adb35);
  put(in_stack_00000010,in_stack_00000008);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator->
            ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)0x1adb4e);
  pos(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return iVar1;
}

Assistant:

bufptr buffer::copy(const buffer& buf)
{
    bufptr other = alloc(buf.size() - buf.pos());
    other->put(buf);
    other->pos(0);
    return other;
}